

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O0

uint32 __thiscall rw::Atomic::streamGetSize(Atomic *this)

{
  int iVar1;
  uint32 local_14;
  uint32 size;
  Atomic *this_local;
  
  iVar1 = PluginList::streamGetSize((PluginList *)&s_plglist,this);
  if (version < 0x30400) {
    local_14 = Geometry::streamGetSize(this->geometry);
    local_14 = local_14 + iVar1 + 0x30;
  }
  else {
    local_14 = iVar1 + 0x28;
  }
  return local_14;
}

Assistant:

uint32
Atomic::streamGetSize(void)
{
	uint32 size = 12 + 12 + 12 + s_plglist.streamGetSize(this);
	if(rw::version < 0x30400)
		size += 12 + this->geometry->streamGetSize();
	else
		size += 4;
	return size;
}